

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

void Acb_NtkWindowUndo(Acb_Ntk_t *p,Vec_Int_t *vWin)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  
  if (0 < vWin->nSize) {
    piVar1 = vWin->pArray;
    lVar3 = 0;
    do {
      if (piVar1[lVar3] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar4 = (uint)piVar1[lVar3] >> 1;
      if ((p->vObjFunc).nSize <= (int)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = (p->vObjFunc).pArray;
      if (piVar2[uVar4] == -1) {
        __assert_fail("Vec_IntEntry(&p->vObjFunc, Abc_Lit2Var(iObj)) != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                      ,0x11a,"void Acb_NtkWindowUndo(Acb_Ntk_t *, Vec_Int_t *)");
      }
      piVar2[uVar4] = -1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vWin->nSize);
  }
  return;
}

Assistant:

void Acb_NtkWindowUndo( Acb_Ntk_t * p, Vec_Int_t * vWin )
{
    int i, iObj;
    Vec_IntForEachEntry( vWin, iObj, i )
    {
        assert( Vec_IntEntry(&p->vObjFunc, Abc_Lit2Var(iObj)) != -1 );
        Vec_IntWriteEntry( &p->vObjFunc, Abc_Lit2Var(iObj), -1 );
    }
}